

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Vector<float,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Refract<2>::doExpand
          (Refract<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_2>_> *arg0;
  ExprP<tcu::Vector<float,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  double __x;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<float> k;
  ExprP<float> k2;
  ExprP<float> k1;
  ExprP<float> dotNI;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> SStack_128;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> local_118;
  allocator<char> local_101;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> local_100;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_f0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_e0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_d0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_c0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> local_b0;
  string local_a0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_80;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_70;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_60;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> local_50;
  float local_40;
  float local_3c;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"dotNI",(allocator<char> *)&local_100);
  dot<2>((Functions *)&local_b0,in_RCX + 1,in_RCX);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_50,&local_a0,(ExpandContext *)args,
             (ExprP<float> *)&local_b0);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::release(&local_50);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_b0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"k1",(allocator<char> *)&local_80);
  local_60.m_ptr._0_4_ = 0x3f800000;
  constant<float>((BuiltinPrecisionTests *)&local_118,(float *)&local_60);
  arg0 = in_RCX + 2;
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_f0,(ExprP<float> *)arg0,(ExprP<float> *)arg0);
  local_70.m_ptr._0_4_ = 0x3f800000;
  constant<float>((BuiltinPrecisionTests *)&local_d0,(float *)&local_70);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_e0,(ExprP<float> *)&local_38,(ExprP<float> *)&local_38)
  ;
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_c0,(ExprP<float> *)&local_d0,(ExprP<float> *)&local_e0)
  ;
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&SStack_128,(ExprP<float> *)&local_f0,
             (ExprP<float> *)&local_c0);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_100,(ExprP<float> *)&local_118,
             (ExprP<float> *)&SStack_128);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_b0,&local_a0,(ExpandContext *)args,
             (ExprP<float> *)&local_100);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_50);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::release(&local_b0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_100);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&SStack_128);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_e0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_118);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"k2",&local_101);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_e0,(ExprP<float> *)&local_38);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_d0,(ExprP<float> *)&local_38,(ExprP<float> *)&local_e0)
  ;
  local_3c = 1.0;
  constant<float>((BuiltinPrecisionTests *)&local_60,&local_3c);
  BuiltinPrecisionTests::operator+
            ((BuiltinPrecisionTests *)&local_c0,(ExprP<float> *)&local_d0,(ExprP<float> *)&local_60)
  ;
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_f0,(ExprP<float> *)&local_c0,(ExprP<float> *)arg0);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_70,(ExprP<float> *)arg0);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&SStack_128,(ExprP<float> *)&local_f0,
             (ExprP<float> *)&local_70);
  local_40 = 1.0;
  constant<float>((BuiltinPrecisionTests *)&local_80,&local_40);
  BuiltinPrecisionTests::operator+
            ((BuiltinPrecisionTests *)&local_118,(ExprP<float> *)&SStack_128,
             (ExprP<float> *)&local_80);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_100,&local_a0,(ExpandContext *)args,
             (ExprP<float> *)&local_118);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_b0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::release(&local_100);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_80);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&SStack_128);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_70);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_60);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"k",(allocator<char> *)&local_f0);
  alternatives<float>((BuiltinPrecisionTests *)&SStack_128,(ExprP<float> *)&local_50,
                      (ExprP<float> *)&local_b0);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_118,&local_a0,(ExpandContext *)args,
             (ExprP<float> *)&SStack_128);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_100);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::release(&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&SStack_128);
  std::__cxx11::string::~string((string *)&local_a0);
  local_3c = 0.0;
  constant<float>((BuiltinPrecisionTests *)&local_118,&local_3c);
  operator<((BuiltinPrecisionTests *)&local_a0,(ExprP<float> *)&local_100,(ExprP<float> *)&local_118
           );
  local_40 = 0.0;
  constant<float>((BuiltinPrecisionTests *)&local_f0,&local_40);
  GenXType<float,_2>::genXType((GenXType<float,_2> *)&SStack_128,(ExprP<float> *)&local_f0);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_d0,in_RCX,(ExprP<float> *)arg0);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_70,(ExprP<float> *)arg0,(ExprP<float> *)&local_38);
  sqrt((Functions *)&local_80,__x);
  BuiltinPrecisionTests::operator+
            ((BuiltinPrecisionTests *)&local_60,(ExprP<float> *)&local_70,(ExprP<float> *)&local_80)
  ;
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_e0,in_RCX + 1,(ExprP<float> *)&local_60);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_c0,(ExprP<tcu::Vector<float,_2>_> *)&local_d0,
             (ExprP<tcu::Vector<float,_2>_> *)&local_e0);
  cond<tcu::Vector<float,2>>
            ((BuiltinPrecisionTests *)this,(ExprP<bool> *)&local_a0,
             (ExprP<tcu::Vector<float,_2>_> *)&SStack_128,(ExprP<tcu::Vector<float,_2>_> *)&local_c0
            );
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> *)
             &local_c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> *)
             &local_e0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_60);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_80);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_70);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> *)
             &local_d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> *)
             &SStack_128);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> *)&local_a0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_100);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_b0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_50);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_38);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&	ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>&	eta		= args.c;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));
		const ExprP<float>	k1		= bindExpression("k1", ctx, constant(1.0f) - eta * eta *
												(constant(1.0f) - dotNI * dotNI));

		const ExprP<float>	k2		= bindExpression("k2", ctx,
												(((dotNI * (-dotNI)) + constant(1.0f)) * eta)
												* (-eta) + constant(1.0f));
		const ExprP<float>	k		= bindExpression("k", ctx, alternatives(k1, k2));

		return cond(k < constant(0.0f),
					genXType<float, Size>(constant(0.0f)),
					i * eta - n * (eta * dotNI + sqrt(k)));
	}